

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool ON_Mesh_Private_AddPerVertexMappingChannels
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_texture_mapping_func,
               ON_MappingRef *mapping_ref,ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache
               ,ON_Material *material,
               unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
               *mappings)

{
  uint mapping_channel_id;
  ON_Texture *pOVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  __node_base_ptr p_Var6;
  ON_MappingChannel *pOVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  long lVar10;
  __hash_code __code;
  double dVar11;
  undefined1 local_80 [16];
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_70;
  _Any_data local_50;
  code *local_40;
  
  if (0 < (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count) {
    lVar10 = 0;
    do {
      pOVar1 = (material->m_textures).super_ON_ClassArray<ON_Texture>.m_a;
      if (pOVar1[lVar10].m_bOn == true) {
        mapping_channel_id = pOVar1[lVar10].m_mapping_channel_id;
        uVar2 = (mappings->_M_h)._M_bucket_count;
        uVar8 = (ulong)mapping_channel_id % uVar2;
        p_Var3 = (mappings->_M_h)._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var3, p_Var9 = p_Var3->_M_nxt,
           mapping_channel_id != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar8) ||
               (p_Var6 = p_Var9, p_Var9 = p_Var4, mapping_channel_id == *(uint *)&p_Var4[1]._M_nxt))
            goto LAB_005075d5;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_005075d5:
        if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
          if (mapping_ref == (ON_MappingRef *)0x0) {
            pOVar7 = (ON_MappingChannel *)0x0;
          }
          else {
            pOVar7 = ON_MappingRef::MappingChannel(mapping_ref,mapping_channel_id);
            if (pOVar7 == (ON_MappingChannel *)0x0) {
              pOVar7 = ON_MappingRef::MappingChannel(mapping_ref,1);
            }
          }
          std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                    ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_50,
                     get_texture_mapping_func);
          ON_Mesh_Private_CacheMappingChannel
                    ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_50,pOVar7,
                     mappings_to_cache,mapping_channel_id,mappings);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count);
  }
  if ((mappings->_M_h)._M_element_count == 0) {
    bVar5 = ON_Material::IsPhysicallyBased(material);
    if (bVar5) {
      ON_Material::PhysicallyBased((ON_Material *)local_80);
      dVar11 = (double)(**(code **)(*(_func_int **)local_80._0_8_ + 0xb8))();
      bVar5 = 0.0 < dVar11;
      if ((ON_UserData *)local_80._8_8_ != (ON_UserData *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      if (mapping_ref == (ON_MappingRef *)0x0) {
        pOVar7 = (ON_MappingChannel *)0x0;
      }
      else {
        pOVar7 = ON_MappingRef::MappingChannel(mapping_ref,1);
      }
      std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_80 + 0x10),
                 get_texture_mapping_func);
      ON_Mesh_Private_CacheMappingChannel
                ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_80 + 0x10),pOVar7
                 ,mappings_to_cache,1,mappings);
      if (local_70.super__Function_base._M_manager != (code *)0x0) {
        (*local_70.super__Function_base._M_manager)
                  ((_Any_data *)(local_80 + 0x10),(_Any_data *)(local_80 + 0x10),__destroy_functor);
      }
    }
  }
  return true;
}

Assistant:

ON_DECL bool ON_Mesh_Private_AddPerVertexMappingChannels(std::function<ON_TextureMapping(const ON_MappingChannel*)> get_texture_mapping_func, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, const ON_Material& material, std::unordered_map<unsigned int, ON_TextureMapping>& mappings)
{
  for (int i = 0; i < material.m_textures.Count(); i++)
  {
    if (material.m_textures[i].m_bOn)
    {
      // Get mapping channel id and check if mapping already is in the map
      const unsigned int mapping_channel_id = material.m_textures[i].m_mapping_channel_id;
      if (mappings.find(mapping_channel_id) == mappings.end())
      {
        const ON_MappingChannel* mapping_channel = nullptr;
        if (mapping_ref)
        {
          // Get texture mapping and add it to the map
          mapping_channel = mapping_ref->MappingChannel(mapping_channel_id);
          if (mapping_channel == nullptr)
          {
            // If a mapping channel is not found using 'mapping_channel_id', then try with a mapping channel id of 1.
            // This is done according to the documentation for ON_Texture::m_mapping_channel_id.
            mapping_channel = mapping_ref->MappingChannel(1);
          }
        }

        if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, mapping_channel_id, mappings))
          return false;
      }
    }
  }

  // If we didn't cache any texture coordinates above, but we have a material with anisotropy,
  // which requires tangents, which in turn requires texture coordinates, then we cache
  // the texture coordinates from mapping channel 1.
  if (mappings.size() == 0)
  {
    if (material.IsPhysicallyBased() && material.PhysicallyBased()->Anisotropic() > 0.0)
    {
      const ON_MappingChannel* mapping_channel = mapping_ref ? mapping_ref->MappingChannel(1) : nullptr;

      if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, 1, mappings))
        return false;
    }
  }

  return true;
}